

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

ScopeInstance * __thiscall
Scope::Instantiate(Scope *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *values)

{
  bool bVar1;
  reference puVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  Scope *in_RDI;
  const_iterator it;
  ScopeInstance *instance;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff98;
  Scope *this_00;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_28;
  undefined1 local_19;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_18;
  
  local_19 = 0;
  this_00 = in_RDI;
  local_18 = in_RDX;
  Scope(in_RDI);
  local_28._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (in_stack_ffffffffffffff98);
  while( true ) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff98);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    in_stack_ffffffffffffff98 = local_18;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_28);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (in_stack_ffffffffffffff98,(ulong)*puVar2);
    Insert(in_RDI,(Index)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)this_00,(int)((ulong)in_RDI >> 0x20));
  }
  return this_00;
}

Assistant:

ScopeInstance Scope::Instantiate(const std::vector<Index>& values) const
{
    ScopeInstance instance;
    for (Scope::const_iterator it=begin();it!=end();it++)
        instance.Insert(values[*it]);
    return instance;
}